

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O0

bool __thiscall LazyARAPlanner::outOfTime(LazyARAPlanner *this)

{
  clock_t cVar1;
  long in_RDI;
  double dVar2;
  double time_used;
  bool local_22;
  bool local_21;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x70) & 1) == 0) {
    cVar1 = clock();
    dVar2 = (double)(cVar1 - *(long *)(in_RDI + 0xc0)) / 1000000.0;
    local_21 = true;
    if (dVar2 < *(double *)(in_RDI + 0x78)) {
      local_22 = false;
      if ((*(byte *)(in_RDI + 0xcc) & 1) != 0) {
        local_22 = false;
        if ((*(double *)(in_RDI + 0xb0) != 1000000000.0) || (NAN(*(double *)(in_RDI + 0xb0)))) {
          local_22 = *(double *)(in_RDI + 0x80) <= dVar2;
        }
      }
      local_21 = local_22;
    }
    local_1 = local_21;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LazyARAPlanner::outOfTime()
{
    // if we are supposed to run until the first solution, then we are never out
    // of time
    if (params.return_first_solution) {
        return false;
    }
    double time_used = double(clock() - TimeStarted) / CLOCKS_PER_SEC;
    if (time_used >= params.max_time) {
        SBPL_DEBUG("out of max time");
    }
    if (use_repair_time && eps_satisfied != INFINITECOST && time_used >= params.repair_time) {
        SBPL_DEBUG("used all repair time...");
    }
    // we are out of time if:
    // we used up the max time limit OR
    // we found some solution and used up the minimum time limit
    return time_used >= params.max_time ||
            (use_repair_time && eps_satisfied != INFINITECOST && time_used >= params.repair_time);
}